

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

QByteArray * removeTrailingSlashes(QByteArray *path)

{
  qsizetype qVar1;
  QByteArray *in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  char in_stack_ffffffffffffffef;
  uint7 in_stack_fffffffffffffff0;
  bool bVar2;
  
  while( true ) {
    qVar1 = QByteArray::size(in_RDI);
    bVar2 = false;
    if (1 < qVar1) {
      bVar2 = QByteArray::endsWith
                        ((QByteArray *)(ulong)in_stack_fffffffffffffff0,in_stack_ffffffffffffffef);
    }
    if (bVar2 == false) break;
    QByteArray::chop((QByteArray *)CONCAT17(bVar2,in_stack_fffffffffffffff0),
                     CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
  }
  return in_RDI;
}

Assistant:

static QByteArray &removeTrailingSlashes(QByteArray &path)
{
    // Darwin doesn't support trailing /'s, so remove for everyone
    while (path.size() > 1 && path.endsWith('/'))
        path.chop(1);

    return path;
}